

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.h
# Opt level: O3

void DataRefs::LogCfgSetting(void *p,int val)

{
  long lVar1;
  
  if ((int)dataRefs.iLogLevel < 1) {
    lVar1 = 0x59;
    do {
      if (*(void **)(ModelIcaoType::gEmptyString_abi_cxx11_ + lVar1 + 0x17) == p) {
        if (*(char *)((long)&DATA_REFS_LT[0].dataName._M_dataplus._M_p + lVar1) != '\x01') {
          return;
        }
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
               ,0x73d,"LogCfgSetting",logDEBUG,"%s = %d",
               *(undefined8 *)((long)&DOC8643_EMPTY.wtc.field_2 + lVar1 + 7),
               CONCAT44((int)((ulong)lVar1 >> 0x20),val));
        return;
      }
      lVar1 = lVar1 + 0x60;
    } while (lVar1 != 0x29f9);
  }
  return;
}

Assistant:

logLevelTy GetLogLevel() const       { return iLogLevel; }